

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
ranges::detail::
print_rng_<std::ostream,ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>const>
          (basic_ostream<char,_std::char_traits<char>_> *sout,
          chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true> *rng)

{
  pointer piVar1;
  vector<int,_std::allocator<int>_> *__nbytes;
  int __fd;
  _result_t<const_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>_&> it;
  iterator_t<CRng> local_68;
  adaptor<true> local_60;
  take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>_>
  local_48;
  
  local_68._M_current._0_1_ = 0x5b;
  std::__ostream_insert<char,std::char_traits<char>>(sout,(char *)&local_68,1);
  local_60.n_ = rng->n_;
  if (0 < local_60.n_) {
    __nbytes = (rng->
               super_view_adaptor<ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>,_ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_(ranges::cardinality)_1>
               ).rng_.rng_;
    local_68._M_current =
         (__nbytes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
    local_60.end_._M_current =
         (__nbytes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    local_60.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
    piVar1 = (__nbytes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_68._M_current != piVar1) {
      __fd = (int)&local_60;
      chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>::
      read((adaptor<true> *)&local_48,__fd,&local_68,(size_t)__nbytes);
      print_rng_<std::ostream,ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(ranges::subrange_kind)1>>const>
                (sout,&local_48);
      chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>::
      next(&local_60,&local_68);
      if (local_68._M_current != piVar1) {
        do {
          local_48._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(sout,(char *)&local_48,1);
          chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::
          adaptor<true>::read((adaptor<true> *)&local_48,__fd,&local_68,(size_t)__nbytes);
          print_rng_<std::ostream,ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(ranges::subrange_kind)1>>const>
                    (sout,&local_48);
          chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::
          adaptor<true>::next(&local_60,&local_68);
        } while (local_68._M_current != piVar1);
      }
    }
    local_48._0_1_ = 0x5d;
    std::__ostream_insert<char,std::char_traits<char>>(sout,(char *)&local_48,1);
    return sout;
  }
  __assert_fail("0 < cv->n_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/chunk.hpp"
                ,0x7e,
                "ranges::chunk_view_<ranges::ref_view<std::vector<int>>, true>::adaptor<true>::adaptor(meta::const_if_c<Const, chunk_view_<Rng, IsForwardRange>> *) [Rng = ranges::ref_view<std::vector<int>>, IsForwardRange = true, Const = true]"
               );
}

Assistant:

Stream & print_rng_(Stream & sout, Rng & rng)
        {
            sout << '[';
            auto it = ranges::begin(rng);
            auto const e = ranges::end(rng);
            if(it != e)
            {
                for(;;)
                {
                    sout << *it;
                    if(++it == e)
                        break;
                    sout << ',';
                }
            }
            sout << ']';
            return sout;
        }